

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *pIVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar8;
  
  pIVar3 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  pIVar1 = &pIVar3->SettingsIniData;
  iVar2 = (pIVar3->SettingsIniData).Buf.Capacity;
  if (iVar2 < 0) {
    pcVar5 = (char *)MemAlloc(0);
    pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar5,pcVar6,(long)(pIVar3->SettingsIniData).Buf.Size);
      MemFree((pIVar3->SettingsIniData).Buf.Data);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar5;
    (pIVar3->SettingsIniData).Buf.Size = 0;
    (pIVar3->SettingsIniData).Buf.Capacity = 0;
  }
  else {
    (pIVar1->Buf).Size = 0;
    if (iVar2 != 0) {
      pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
      lVar7 = 0;
      goto LAB_001907d4;
    }
  }
  pcVar6 = (char *)MemAlloc(8);
  pcVar5 = (pIVar3->SettingsIniData).Buf.Data;
  if (pcVar5 != (char *)0x0) {
    memcpy(pcVar6,pcVar5,(long)(pIVar3->SettingsIniData).Buf.Size);
    MemFree((pIVar3->SettingsIniData).Buf.Data);
  }
  (pIVar3->SettingsIniData).Buf.Data = pcVar6;
  (pIVar3->SettingsIniData).Buf.Capacity = 8;
  lVar7 = (long)(pIVar3->SettingsIniData).Buf.Size;
LAB_001907d4:
  pcVar6[lVar7] = '\0';
  (pIVar3->SettingsIniData).Buf.Size = (pIVar3->SettingsIniData).Buf.Size + 1;
  lVar7 = (long)(pIVar3->SettingsHandlers).Size;
  if (lVar7 != 0) {
    pIVar8 = (pIVar3->SettingsHandlers).Data;
    lVar7 = lVar7 * 0x48;
    do {
      (*pIVar8->WriteAllFn)(pIVar3,pIVar8,pIVar1);
      pIVar8 = pIVar8 + 1;
      lVar7 = lVar7 + -0x48;
    } while (lVar7 != 0);
  }
  if (out_size != (size_t *)0x0) {
    iVar2 = (pIVar1->Buf).Size;
    iVar4 = iVar2 + -1;
    if (iVar2 == 0) {
      iVar4 = 0;
    }
    *out_size = (long)iVar4;
  }
  pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
  pcVar5 = ImGuiTextBuffer::EmptyString;
  if (pcVar6 != (char *)0x0) {
    pcVar5 = pcVar6;
  }
  return pcVar5;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        handler.WriteAllFn(&g, &handler, &g.SettingsIniData);
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}